

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_wrapper.cpp
# Opt level: O0

bool __thiscall pstore::command_line::word_wrapper::operator==(word_wrapper *this,word_wrapper *rhs)

{
  __type_conflict _Var1;
  __type_conflict local_19;
  word_wrapper *rhs_local;
  word_wrapper *this_local;
  
  _Var1 = std::operator==(this->text_,rhs->text_);
  local_19 = false;
  if (((_Var1) && (local_19 = false, this->max_width_ == rhs->max_width_)) &&
     (local_19 = false, this->start_pos_ == rhs->start_pos_)) {
    local_19 = std::operator==(&this->substr_,&rhs->substr_);
  }
  return local_19;
}

Assistant:

bool word_wrapper::operator== (word_wrapper const & rhs) const {
                return text_ == rhs.text_ && max_width_ == rhs.max_width_ &&
                       start_pos_ == rhs.start_pos_ && substr_ == rhs.substr_;
            }